

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O0

String * __thiscall String::operator+(String *__return_storage_ptr__,String *this,char (*str) [2])

{
  String *other;
  String local_70;
  String local_48;
  char (*local_20) [2];
  char (*str_local) [2];
  String *this_local;
  
  local_20 = str;
  str_local = (char (*) [2])this;
  this_local = __return_storage_ptr__;
  String(&local_48,this);
  String<2ul>(&local_70,local_20);
  other = append(&local_48,&local_70);
  String(__return_storage_ptr__,other);
  ~String(&local_70);
  ~String(&local_48);
  return __return_storage_ptr__;
}

Assistant:

bool operator==(const char (&str)[N]) const {return data->len == N - 1 && Memory::compare(data->str, str, (N - 1) * sizeof(char)) == 0;}